

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

HashFunction flatbuffers::FindHashFunction16(char *name)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x30) {
      return (HashFunction)0x0;
    }
    iVar2 = strcmp(name,*(char **)((long)&kHashFunctions16 + lVar3));
    lVar1 = lVar3 + 0x10;
  } while (iVar2 != 0);
  return *(HashFunction *)((long)&PTR_HashFnv1<unsigned_short>_00163b98 + lVar3);
}

Assistant:

inline NamedHashFunction<uint16_t>::HashFunction FindHashFunction16(
    const char *name) {
  std::size_t size = sizeof(kHashFunctions16) / sizeof(kHashFunctions16[0]);
  for (std::size_t i = 0; i < size; ++i) {
    if (std::strcmp(name, kHashFunctions16[i].name) == 0) {
      return kHashFunctions16[i].function;
    }
  }
  return nullptr;
}